

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeNdPoints.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [8];
  int N;
  int iVar2;
  vector<float,_std::allocator<float>_> local_80;
  undefined1 auStack_68 [8];
  vector<float,_std::allocator<float>_> pt;
  vector<float,_std::allocator<float>_> local_48;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Must include a number!!\n",0x18);
  }
  else {
    N = atoi(argv[1]);
    auStack_68 = (undefined1  [8])0x0;
    pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    iVar2 = 10;
    do {
      CreateRandomPoint(&local_48,N);
      auVar1 = auStack_68;
      auStack_68 = (undefined1  [8])
                   local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
      pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
           = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
      pt.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
           = local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (auVar1 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar1);
      }
      if (local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::vector<float,_std::allocator<float>_>::vector
                (&local_80,(vector<float,_std::allocator<float>_> *)auStack_68);
      print(&local_80);
      if (local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_start != (pointer)0x0) {
        operator_delete(local_80.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      iVar2 = iVar2 + -1;
    } while (iVar2 != 0);
    if (auStack_68 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_68);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char ** argv)
{
	
    int n; // dimension of the point space
	const int M = 10; //number of points to generate
    
    if( argc < 2)
    {
        std::cerr<< "Must include a number!!\n";
        return 0;
    }
    n = std::atoi( argv[1] );
	
	//create list of M random points
	std::vector<numType> pt;
	for(auto i=0; i < M ; i++)
	{
		pt = CreateRandomPoint(n);
		print( pt );	
	}
}